

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double lerch(double a,double b,double c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  undefined8 local_18;
  double sum2_old;
  
  dVar3 = 1.0;
  iVar1 = 0;
  local_18 = 0.0;
  while( true ) {
    while( true ) {
      dVar2 = (double)iVar1 + c;
      if ((dVar2 != 0.0) || (NAN(dVar2))) break;
      iVar1 = iVar1 + 1;
      dVar3 = dVar3 * a;
    }
    dVar2 = pow(dVar2,b);
    dVar2 = dVar3 / dVar2 + local_18;
    if (dVar2 <= local_18) break;
    iVar1 = iVar1 + 1;
    dVar3 = dVar3 * a;
    local_18 = dVar2;
  }
  return dVar2;
}

Assistant:

double lerch ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    LERCH estimates the Lerch transcendent function.
//
//  Discussion:
//
//    The Lerch transcendent function is defined as:
//
//      LERCH ( A, B, C ) = Sum ( 0 <= K < Infinity ) A^K / ( C + K )^B
//
//    excluding any term with ( C + K ) = 0.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein, editor,
//    CRC Concise Encylopedia of Mathematics,
//    CRC Press, 1998.
//
//  Thanks:
//
//    Oscar van Vlijmen
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the function.
//
//    Output, double LERCH, an approximation to the Lerch
//    transcendent function.
//
{
  double a_k;
  int k;
  double sum2;
  double sum2_old;

  sum2 = 0.0;
  k = 0;
  a_k = 1.0;

  for ( ; ; )
  {
    sum2_old = sum2;

    if ( c + static_cast<double>(k ) == 0.0 )
    {
      k = k + 1;
      a_k = a_k * a;
      continue;
    }

    sum2 = sum2 + a_k / pow ( c + static_cast<double>(k ), b );

    if ( sum2 <= sum2_old )
    {
      break;
    }

    k = k + 1;
    a_k = a_k * a;
  }
  return sum2;
}